

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccpp.c
# Opt level: O2

int macro_subst_tok(TokenString *tok_str,Sym **nested_list,Sym *s)

{
  char cVar1;
  uint uVar2;
  Sym **ppSVar3;
  undefined4 v;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  anon_union_8_3_a16eda46_for_Sym_3 extraout_RAX;
  tm *ptVar7;
  Sym *pSVar8;
  anon_union_8_3_a16eda46_for_Sym_3 extraout_RAX_00;
  Sym *pSVar9;
  anon_union_8_3_a16eda46_for_Sym_3 aVar10;
  anon_union_8_3_a16eda46_for_Sym_3 extraout_RAX_01;
  anon_union_8_3_a16eda46_for_Sym_3 extraout_RAX_02;
  char *pcVar11;
  anon_union_8_3_a16eda46_for_Sym_3 macro_str;
  int i;
  anon_union_8_3_a16eda46_for_Sym_3 *__s;
  long lVar12;
  char *fmt;
  int iVar13;
  bool bVar14;
  undefined1 auStack_1c8 [8];
  TokenString str;
  time_t ti;
  TokenString ws_str;
  anon_union_8_3_a16eda46_for_Sym_3 aStack_148;
  char buf [32];
  undefined1 auStack_108 [8];
  CString cstr;
  undefined1 auStack_c8 [8];
  CString cstr_1;
  Sym *local_a8;
  Sym *args;
  undefined1 local_98 [8];
  CValue cval_1;
  int iStack_80;
  int spc_1;
  long local_78;
  Sym **local_70;
  anon_union_8_3_a16eda46_for_Sym_3 local_68;
  int local_5c;
  undefined4 uStack_58;
  int spc;
  anon_union_8_3_a16eda46_for_Sym_3 local_50;
  int *st;
  undefined4 uStack_40;
  int t;
  int local_34;
  
  local_70 = nested_list;
  if (tok == 0x14d) {
    uVar2 = pp_counter;
    pp_counter = pp_counter + 1;
LAB_0011f802:
    __s = &aStack_148;
    snprintf((char *)&__s->enum_val,0x20,"%d",(ulong)uVar2);
    iVar13 = 0xbe;
  }
  else {
    if (tok == 0x148) {
      __s = (anon_union_8_3_a16eda46_for_Sym_3 *)file->filename;
    }
    else {
      if (tok == 0x147) {
        uVar2 = file->line_num;
        goto LAB_0011f802;
      }
      if (1 < tok - 0x149U) {
        _uStack_40 = (anon_union_8_3_a16eda46_for_Sym_3)
                     *(anon_union_8_3_a16eda46_for_Sym_3 *)&(s->field_3).field_0;
        aVar10 = _uStack_40;
        if ((int *)_uStack_40 == (int *)0x0) goto LAB_0011f86a;
        local_78 = CONCAT44(local_78._4_4_,parse_flags);
        args = s;
        if ((s->type).t == 1) {
          ti = 0;
          ws_str.str = (int *)0x0;
          local_5c = 0;
          ws_str.len = 0;
          ws_str.lastlen = -1;
          parse_flags = parse_flags | 0x34;
          cstr_1._20_4_ = next_argstream(nested_list,(TokenString *)&ti);
          if (cstr_1._20_4_ == 0x28) {
            tok_str_free_str((int *)ti);
            do {
              next_nomacro();
            } while (tok == 0xcb);
            local_a8 = (Sym *)0x0;
            pSVar9 = (s->field_5).next;
            local_68 = (anon_union_8_3_a16eda46_for_Sym_3)0x0;
LAB_0011f998:
            do {
              do {
                next_argstream(local_70,(TokenString *)0x0);
              } while (tok == 10);
            } while (((uint)tok < 0x21 & (byte)(0x100003a00 >> ((byte)tok & 0x3f))) != 0);
            bVar14 = tok == 0x29;
            do {
              if ((bool)((local_a8 == (Sym *)0x0 && pSVar9 == (Sym *)0x0) & bVar14)) {
LAB_0011fbb8:
                parse_flags = (int)local_78;
                _uStack_58 = _uStack_40;
                aStack_148.enum_val = 0;
                buf[0] = '\0';
                buf[1] = '\0';
                buf[2] = '\0';
                buf[3] = '\0';
                buf[4] = '\0';
                buf[5] = '\0';
                buf[6] = '\0';
                buf[7] = '\0';
                buf[8] = '\0';
                buf[9] = '\0';
                buf[10] = '\0';
                buf[0xb] = '\0';
                buf[0xc] = -1;
                buf[0xd] = -1;
                buf[0xe] = -1;
                buf[0xf] = -1;
                iVar13 = 0;
                local_34 = 0;
                goto LAB_0011fbf3;
              }
              if (pSVar9 == (Sym *)0x0) {
                pcVar11 = get_tok_str(args->v,(CValue *)0x0);
                fmt = "macro \'%s\' used with too many args";
                goto LAB_00120345;
              }
              auStack_1c8 = (undefined1  [8])0x0;
              str.str = (int *)0x0;
              str.len = 0;
              str.lastlen = -1;
              local_5c = 0;
              iVar13 = 0;
LAB_0011f9fe:
              if (0 < iVar13) {
LAB_0011fa19:
                if (tok + 1U < 2) goto LAB_0011fa90;
                if (tok == 10) {
                  tok = 0x20;
                  iVar6 = 0x20;
                }
                else if (tok == 0x29) {
                  iVar13 = iVar13 + -1;
                  iVar6 = 0x29;
                }
                else {
                  iVar6 = tok;
                  if (tok == 0x28) {
                    iVar13 = iVar13 + 1;
                    iVar6 = 0x28;
                  }
                }
LAB_0011fa5f:
                iVar5 = check_space(iVar6,&local_5c);
                if (iVar5 == 0) {
                  tok_str_add2((TokenString *)auStack_1c8,iVar6,&tokc);
                }
                next_argstream(local_70,(TokenString *)0x0);
                goto LAB_0011f9fe;
              }
              if (tok == 0x2c) {
                if ((pSVar9->type).t == 0) goto LAB_0011fa90;
                iVar6 = 0x2c;
                goto LAB_0011fa5f;
              }
              if (tok != 0x29) goto LAB_0011fa19;
LAB_0011fa90:
              if (iVar13 != 0) {
                expect(")");
              }
              str.str = (int *)CONCAT44(str.str._4_4_,(int)str.str - local_5c);
              tok_str_add((TokenString *)auStack_1c8,-1);
              tok_str_add((TokenString *)auStack_1c8,0);
              pSVar8 = sym_push2(&local_a8,pSVar9->v & 0xdfffffff,(pSVar9->type).t,0);
              pSVar8->field_3 = (anon_union_8_3_a16eda46_for_Sym_3)auStack_1c8;
              pSVar9 = (pSVar9->field_5).next;
              if (tok != 0x29) goto LAB_0011fb23;
              if (pSVar9 == (Sym *)0x0) {
                local_68 = (anon_union_8_3_a16eda46_for_Sym_3)local_a8;
                goto LAB_0011fbb8;
              }
              if (((pSVar9->type).t == 0) || (bVar14 = true, gnu_ext == 0)) {
                pcVar11 = get_tok_str(args->v,(CValue *)0x0);
                fmt = "macro \'%s\' used with too few args";
LAB_00120345:
                tcc_error(fmt,pcVar11);
              }
            } while( true );
          }
          parse_flags = (int)local_78;
          tok_str_add(tok_str,tok);
          if ((parse_flags & 0x10U) != 0) {
            for (lVar12 = 0; lVar12 < (int)ws_str.str; lVar12 = lVar12 + 1) {
              tok_str_add(tok_str,*(int *)(ti + lVar12 * 4));
            }
          }
          tok_str_free_str((int *)ti);
          aVar10 = extraout_RAX_00;
          goto LAB_0011ff83;
        }
        goto LAB_0011ff97;
      }
      time((time_t *)&str.alloc);
      ptVar7 = localtime((time_t *)&str.alloc);
      if (tok == 0x149) {
        __s = &aStack_148;
        snprintf((char *)&__s->enum_val,0x20,"%s %2d %d",ab_month_name + ptVar7->tm_mon,
                 (ulong)(uint)ptVar7->tm_mday,(ulong)(ptVar7->tm_year + 0x76c));
      }
      else {
        __s = &aStack_148;
        snprintf((char *)&__s->enum_val,0x20,"%02d:%02d:%02d",(ulong)(uint)ptVar7->tm_hour,
                 (ulong)(uint)ptVar7->tm_min,(ulong)(uint)ptVar7->tm_sec);
      }
    }
    iVar13 = 0xb9;
  }
  auStack_108 = (undefined1  [8])0x0;
  cstr.size = 0;
  cstr._4_4_ = 0;
  cstr.data = (void *)0x0;
  cstr_cat((CString *)auStack_108,(char *)&__s->enum_val,0);
  auStack_1c8._0_4_ = auStack_108._0_4_;
  str.str = (int *)cstr._0_8_;
  tok_str_add2(tok_str,iVar13,(CValue *)auStack_1c8);
  cstr_free((CString *)auStack_108);
  aVar10 = extraout_RAX;
LAB_0011f86a:
  return aVar10.field_0.c;
LAB_0011fbf3:
  while( true ) {
    uStack_40 = local_34;
    local_34 = iVar13;
    TOK_GET((int *)((long)&st + 4),(int **)&stack0xffffffffffffffa8,(CValue *)local_98);
    iVar13 = st._4_4_;
    if (st._4_4_ != 0x23) break;
    TOK_GET((int *)((long)&st + 4),(int **)&stack0xffffffffffffffa8,(CValue *)local_98);
    iVar13 = st._4_4_;
    if ((st._4_4_ == 0) || (pSVar9 = sym_find2((Sym *)local_68,st._4_4_), pSVar9 == (Sym *)0x0)) {
      expect("macro parameter after \'#\'");
    }
    auStack_c8 = (undefined1  [8])0x0;
    cstr_1.size = 0;
    cstr_1._4_4_ = 0;
    cstr_1.data = (void *)0x0;
    cstr_ccat((CString *)auStack_c8,0x22);
    local_50 = (anon_union_8_3_a16eda46_for_Sym_3)(pSVar9->field_3).d;
    cval_1.tab[3] = 0;
    while (-1 < *local_50.d) {
      TOK_GET((int *)((long)&st + 4),&local_50.d,(CValue *)local_98);
      iVar13 = st._4_4_;
      if ((st._4_4_ - 0xcdU < 0xfffffffe) &&
         (iVar6 = check_space(st._4_4_,cval_1.tab + 3), iVar6 == 0)) {
        pcVar11 = get_tok_str(iVar13,(CValue *)local_98);
        while( true ) {
          cVar1 = *pcVar11;
          if (cVar1 == '\0') break;
          if ((iVar13 == 0xbf) && (cVar1 != '\'')) {
            add_char((CString *)auStack_c8,(int)cVar1);
          }
          else {
            cstr_ccat((CString *)auStack_c8,(int)cVar1);
          }
          pcVar11 = pcVar11 + 1;
        }
      }
    }
    auStack_c8._0_4_ = auStack_c8._0_4_ - cval_1._12_4_;
    cstr_ccat((CString *)auStack_c8,0x22);
    cstr_ccat((CString *)auStack_c8,0);
    local_98._0_4_ = auStack_c8._0_4_;
    cval_1.d = (double)cstr_1._0_8_;
    tok_str_add2((TokenString *)&aStack_148.field_0,0xbf,(CValue *)local_98);
    cstr_free((CString *)auStack_c8);
  }
  if (st._4_4_ != 0) {
    if (st._4_4_ < 0x100) {
      tok_str_add2((TokenString *)&aStack_148.field_0,st._4_4_,(CValue *)local_98);
    }
    else {
      pSVar9 = sym_find2((Sym *)local_68,st._4_4_);
      iVar6 = iVar13;
      if (pSVar9 == (Sym *)0x0) goto LAB_0011ff05;
      _iStack_80 = buf._0_8_ & 0xffffffff;
      local_50 = (anon_union_8_3_a16eda46_for_Sym_3)(pSVar9->field_3).d;
      if (*_uStack_58 == 0xcd || local_34 == 0xcd) {
        if ((((local_34 == 0xcd) && (uStack_40 == 0x2c)) && (gnu_ext != 0)) &&
           ((pSVar9->type).t != 0)) {
          if (0 < *local_50.d) {
            buf._0_4_ = (int)buf._0_8_ + -1;
            goto LAB_0011fccc;
          }
          buf._0_4_ = (int)buf._0_8_ + -2;
        }
      }
      else {
LAB_0011fccc:
        pSVar8 = (pSVar9->field_5).next;
        if (pSVar8 == (Sym *)0x0) {
          ws_str._48_8_ = pSVar9;
          _uStack_40 = local_50;
          sym_push2(&(pSVar9->field_5).next,pSVar9->v,(pSVar9->type).t,0);
          auStack_108 = (undefined1  [8])0x0;
          cstr.size = 0;
          cstr._4_4_ = 0;
          cstr.data = (void *)0xffffffff00000000;
          macro_subst((TokenString *)auStack_108,local_70,_uStack_40);
          tok_str_add((TokenString *)auStack_108,0);
          *(undefined1 (*) [8])(*(long *)(ws_str._48_8_ + 0x20) + 8) = auStack_108;
          pSVar8 = *(Sym **)(ws_str._48_8_ + 0x20);
        }
        local_50 = pSVar8->field_3;
      }
      while( true ) {
        TOK_GET((int *)auStack_108,&local_50.d,(CValue *)local_98);
        if ((int)auStack_108._0_4_ < 1) break;
        tok_str_add2((TokenString *)&aStack_148.field_0,auStack_108._0_4_,(CValue *)local_98);
      }
      if (buf._0_4_ == (int)_iStack_80) {
        iVar6 = 0xcb;
LAB_0011ff05:
        iVar5 = local_34;
        tok_str_add((TokenString *)&aStack_148.field_0,iVar6);
        local_34 = iVar5;
      }
    }
    goto LAB_0011fbf3;
  }
  tok_str_add((TokenString *)&aStack_148.field_0,0);
  _uStack_40 = aStack_148.field_0;
  aVar10 = aStack_148;
  pSVar9 = local_a8;
  while (s = args, pSVar9 != (Sym *)0x0) {
    pSVar8 = pSVar9->prev;
    tok_str_free_str((pSVar9->field_3).d);
    if ((pSVar9->field_5).next != (Sym *)0x0) {
      tok_str_free_str((((pSVar9->field_5).next)->field_3).d);
      sym_free((pSVar9->field_5).next);
    }
    sym_free(pSVar9);
    aVar10 = extraout_RAX_01;
    pSVar9 = pSVar8;
  }
LAB_0011ff83:
  if (cstr_1._20_4_ != 0x28) goto LAB_0011f86a;
LAB_0011ff97:
  sym_push2(local_70,s->v,0,0);
  parse_flags = (int)local_78;
  local_98 = (undefined1  [8])_uStack_40;
  do {
    TOK_GET(&stack0xffffffffffffffa8,(int **)local_98,(CValue *)&ti);
    if (uStack_58 == 0) {
      aVar10.enum_val = 0;
      goto LAB_001202a4;
    }
  } while (uStack_58 != 0xcd);
  aStack_148.enum_val = 0;
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = -1;
  buf[0xd] = -1;
  buf[0xe] = -1;
  buf[0xf] = -1;
  local_98 = (undefined1  [8])_uStack_40;
  local_34 = -1;
  while( true ) {
    do {
      TOK_GET(&stack0xffffffffffffffa8,(int **)local_98,(CValue *)&ti);
    } while (uStack_58 == 0xcd);
    uVar4 = uStack_58;
    iVar13 = local_34;
    if (uStack_58 == 0) break;
LAB_0012004d:
    iVar6 = uVar4;
    if (*(int *)local_98 == 0xcd) {
      if (-1 < iVar13) {
        buf[0] = (char)iVar13;
        buf[1] = (char)((uint)iVar13 >> 8);
        buf[2] = (char)((uint)iVar13 >> 0x10);
        buf[3] = (char)((uint)iVar13 >> 0x18);
      }
      do {
        iVar5 = *(int *)((long)local_98 + 4);
        local_98 = (undefined1  [8])((long)local_98 + 4);
      } while (iVar5 == 0xcc);
      uVar4 = iVar6;
      if ((iVar5 != 0) && (iVar5 != 0xcd)) {
        local_50.field_0.c = iVar5;
        TOK_GET((int *)&local_50.enum_val,(int **)local_98,(CValue *)auStack_c8);
        v = local_50.field_0.c;
        uVar4 = 0xcb;
        iVar13 = local_34;
        if (local_50.field_0.c != 0xcb || iVar6 != 0xcb) {
          cstr.data = (void *)0x0;
          auStack_108 = (undefined1  [8])0x0;
          cstr.size = 0;
          cstr._4_4_ = 0;
          auStack_108._0_4_ = 0;
          if (iVar6 != 0xcb) {
            pcVar11 = get_tok_str(iVar6,(CValue *)&ti);
            cstr_cat((CString *)auStack_108,pcVar11,-1);
          }
          _iStack_80 = CONCAT44(spc_1,auStack_108._0_4_);
          local_68.field_0.c = v;
          if (v != 0xcb) {
            pcVar11 = get_tok_str(v,(CValue *)auStack_c8);
            cstr_cat((CString *)auStack_108,pcVar11,-1);
          }
          cstr_ccat((CString *)auStack_108,0);
          uVar4 = auStack_108._0_4_;
          tcc_open_bf(tcc_state,":paste:",auStack_108._0_4_);
          local_78 = cstr._0_8_;
          memcpy(file->buffer,(void *)cstr._0_8_,(long)(int)uVar4);
          tok_flags = 0;
          do {
            next_nomacro1();
            if (*file->buf_ptr == '\0') {
              tcc_close();
              cstr_free((CString *)auStack_108);
              ti = tokc.i;
              ws_str.str = (int *)tokc.str.data;
              uVar4 = tok;
              iVar13 = local_34;
              goto LAB_0012004d;
            }
          } while (((ulong)(uint)tok < 0x21) &&
                  ((0x100003a00U >> ((ulong)(uint)tok & 0x3f) & 1) != 0));
          tcc_warning("pasting \"%.*s\" and \"%s\" does not give a valid preprocessing token",
                      (long)iStack_80,local_78,local_78 + iStack_80);
          tcc_close();
          cstr_free((CString *)auStack_108);
          tok_str_add2((TokenString *)&aStack_148.field_0,iVar6,(CValue *)&ti);
          ti = (time_t)auStack_c8;
          ws_str.str = (int *)cstr_1._0_8_;
          uVar4 = local_68._0_4_;
          iVar13 = local_34;
        }
      }
      goto LAB_0012004d;
    }
    uStack_58 = iVar6;
    local_34 = iVar13;
    if (iVar13 < 0) {
      local_34 = buf._0_4_;
    }
    if (iVar6 != 0xcc) {
      local_34 = -1;
    }
    tok_str_add2((TokenString *)&aStack_148.field_0,iVar6,(CValue *)&ti);
  }
  tok_str_add((TokenString *)&aStack_148.field_0,0);
  aVar10 = aStack_148;
LAB_001202a4:
  ppSVar3 = local_70;
  macro_str = aVar10;
  if (aVar10.enum_val == 0) {
    macro_str = _uStack_40;
  }
  macro_subst(tok_str,local_70,macro_str.d);
  pSVar9 = *ppSVar3;
  *ppSVar3 = pSVar9->prev;
  sym_free(pSVar9);
  pSVar9 = args;
  if (aVar10.enum_val != 0) {
    tok_str_free_str(aVar10.d);
  }
  aVar10 = _uStack_40;
  if (_uStack_40 != (pSVar9->field_3).enum_val) {
    tok_str_free_str(_uStack_40);
    aVar10 = extraout_RAX_02;
  }
  goto LAB_0011f86a;
LAB_0011fb23:
  if (tok != 0x2c) {
    expect(",");
  }
  goto LAB_0011f998;
}

Assistant:

static int macro_subst_tok(TokenString* tok_str, Sym** nested_list, Sym* s) {
  Sym *args, *sa, *sa1;
  int parlevel, t, t1, spc;
  TokenString str;
  char* cstrval;
  CValue cval;
  CString cstr;
  char buf[32];

  /* if symbol is a macro, prepare substitution */
  /* special macros */
  if (tok == TOK___LINE__ || tok == TOK___COUNTER__) {
    t = tok == TOK___LINE__ ? file->line_num : pp_counter++;
    snprintf(buf, sizeof(buf), "%d", t);
    cstrval = buf;
    t1 = TOK_PPNUM;
    goto add_cstr1;
  } else if (tok == TOK___FILE__) {
    cstrval = file->filename;
    goto add_cstr;
  } else if (tok == TOK___DATE__ || tok == TOK___TIME__) {
    time_t ti;
    struct tm* tm;

    time(&ti);
    tm = localtime(&ti);
    if (tok == TOK___DATE__) {
      snprintf(buf, sizeof(buf), "%s %2d %d", ab_month_name[tm->tm_mon], tm->tm_mday, tm->tm_year + 1900);
    } else {
      snprintf(buf, sizeof(buf), "%02d:%02d:%02d", tm->tm_hour, tm->tm_min, tm->tm_sec);
    }
    cstrval = buf;
  add_cstr:
    t1 = TOK_STR;
  add_cstr1:
    cstr_new(&cstr);
    cstr_cat(&cstr, cstrval, 0);
    cval.str.size = cstr.size;
    cval.str.data = cstr.data;
    tok_str_add2(tok_str, t1, &cval);
    cstr_free(&cstr);
  } else if (s->d) {
    int saved_parse_flags = parse_flags;
    int* joined_str = NULL;
    int* mstr = s->d;

    if (s->type.t == MACRO_FUNC) {
      /* whitespace between macro name and argument list */
      TokenString ws_str;
      tok_str_new(&ws_str);

      spc = 0;
      parse_flags |= PARSE_FLAG_SPACES | PARSE_FLAG_LINEFEED | PARSE_FLAG_ACCEPT_STRAYS;

      /* get next token from argument stream */
      t = next_argstream(nested_list, &ws_str);
      if (t != '(') {
        /* not a macro substitution after all, restore the
         * macro token plus all whitespace we've read.
         * whitespace is intentionally not merged to preserve
         * newlines. */
        parse_flags = saved_parse_flags;
        tok_str_add(tok_str, tok);
        if (parse_flags & PARSE_FLAG_SPACES) {
          int i;
          for (i = 0; i < ws_str.len; i++)
            tok_str_add(tok_str, ws_str.str[i]);
        }
        tok_str_free_str(ws_str.str);
        return 0;
      } else {
        tok_str_free_str(ws_str.str);
      }
      do {
        next_nomacro(); /* eat '(' */
      } while (tok == TOK_PLCHLDR);

      /* argument macro */
      args = NULL;
      sa = s->next;
      /* NOTE: empty args are allowed, except if no args */
      for (;;) {
        do {
          next_argstream(nested_list, NULL);
        } while (is_space(tok) || TOK_LINEFEED == tok);
      empty_arg:
        /* handle '()' case */
        if (!args && !sa && tok == ')')
          break;
        if (!sa)
          tcc_error("macro '%s' used with too many args", get_tok_str(s->v, 0));
        tok_str_new(&str);
        parlevel = spc = 0;
        /* NOTE: non zero sa->t indicates VA_ARGS */
        while ((parlevel > 0 || (tok != ')' && (tok != ',' || sa->type.t)))) {
          if (tok == TOK_EOF || tok == 0)
            break;
          if (tok == '(')
            parlevel++;
          else if (tok == ')')
            parlevel--;
          if (tok == TOK_LINEFEED)
            tok = ' ';
          if (!check_space(tok, &spc))
            tok_str_add2(&str, tok, &tokc);
          next_argstream(nested_list, NULL);
        }
        if (parlevel)
          expect(")");
        str.len -= spc;
        tok_str_add(&str, -1);
        tok_str_add(&str, 0);
        sa1 = sym_push2(&args, sa->v & ~SYM_FIELD, sa->type.t, 0);
        sa1->d = str.str;
        sa = sa->next;
        if (tok == ')') {
          /* special case for gcc var args: add an empty
             var arg argument if it is omitted */
          if (sa && sa->type.t && gnu_ext)
            goto empty_arg;
          break;
        }
        if (tok != ',')
          expect(",");
      }
      if (sa) {
        tcc_error("macro '%s' used with too few args", get_tok_str(s->v, 0));
      }

      parse_flags = saved_parse_flags;

      /* now subst each arg */
      mstr = macro_arg_subst(nested_list, mstr, args);
      /* free memory */
      sa = args;
      while (sa) {
        sa1 = sa->prev;
        tok_str_free_str(sa->d);
        if (sa->next) {
          tok_str_free_str(sa->next->d);
          sym_free(sa->next);
        }
        sym_free(sa);
        sa = sa1;
      }
    }

    sym_push2(nested_list, s->v, 0, 0);
    parse_flags = saved_parse_flags;
    joined_str = macro_twosharps(mstr);
    macro_subst(tok_str, nested_list, joined_str ? joined_str : mstr);

    /* pop nested defined symbol */
    sa1 = *nested_list;
    *nested_list = sa1->prev;
    sym_free(sa1);
    if (joined_str)
      tok_str_free_str(joined_str);
    if (mstr != s->d)
      tok_str_free_str(mstr);
  }
  return 0;
}